

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

char * __thiscall google::anon_unknown_1::FlagValue::TypeName(FlagValue *this)

{
  FlagValue *this_local;
  
  if ('\x06' < this->type_) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x1a2,"const char *google::(anonymous namespace)::FlagValue::TypeName() const");
  }
  return "bool" + this->type_ * 7;
}

Assistant:

const char* FlagValue::TypeName() const {
  static const char types[] =
      "bool\0xx"
      "int32\0x"
      "uin32\0x"
      "int64\0x"
      "uint64\0"
      "double\0"
      "string";
  if (type_ > FV_MAX_INDEX) {
    assert(false);
    return "";
  }
  // Directly indexing the strings in the 'types' string, each of them is 7 bytes long.
  return &types[type_ * 7];
}